

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

Vec_Int_t * Abc_BufSortByDelay(Buf_Man_t *p,int iPivot)

{
  Vec_Ptr_t *pVVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *__ptr;
  long lVar4;
  
  pVVar3 = p->vDelays;
  pVVar3->nSize = 0;
  if ((iPivot < 0) || (pVVar1 = p->pNtk->vObjs, pVVar1->nSize <= iPivot)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pObj = (Abc_Obj_t *)pVVar1->pArray[(uint)iPivot];
  if ((pObj->vFanouts).nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    do {
      iVar2 = Abc_BufEdgeSlack(p,pObj,(Abc_Obj_t *)
                                      pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]]);
      if (iVar2 < 0) {
        __assert_fail("Slack >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x2ff,"Vec_Int_t *Abc_BufSortByDelay(Buf_Man_t *, int)");
      }
      Vec_IntPush(p->vDelays,iVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pObj->vFanouts).nSize);
    pVVar3 = p->vDelays;
    iVar2 = pVVar3->nSize;
  }
  __ptr = Abc_QuickSortCost(pVVar3->pArray,iVar2,0);
  p->vOrder->nSize = 0;
  if (p->vDelays->nSize < 1) {
    if (__ptr == (int *)0x0) goto LAB_00456da3;
  }
  else {
    lVar4 = 0;
    do {
      Vec_IntPush(p->vOrder,
                  *(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[__ptr[lVar4]]] +
                          0x10));
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->vDelays->nSize);
  }
  free(__ptr);
LAB_00456da3:
  return p->vOrder;
}

Assistant:

Vec_Int_t * Abc_BufSortByDelay( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, Slack, * pOrder;
    Vec_IntClear( p->vDelays );
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack(p, pObj, pFanout);
        assert( Slack >= 0 );
        Vec_IntPush( p->vDelays, Abc_MaxInt(0, Slack) );
    }
    pOrder = Abc_QuickSortCost( Vec_IntArray(p->vDelays), Vec_IntSize(p->vDelays), 0 );
    Vec_IntClear( p->vOrder );
    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
        Vec_IntPush( p->vOrder, Abc_ObjId(Abc_ObjFanout(pObj, pOrder[i])) );
    ABC_FREE( pOrder );
//    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
//        printf( "%5d - %5d   ", Vec_IntEntry(p->vOrder, i), Abc_BufEdgeSlack(p, pObj, Abc_NtkObj(p->pNtk, Vec_IntEntry(p->vOrder, i))) );
    return p->vOrder;        
}